

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight1.cpp
# Opt level: O2

bool gl_GetLight(int group,Plane *p,ADynamicLight *light,bool checkside,FDynLightData *ldata)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_80;
  DVector3 pos;
  undefined8 local_48;
  Vector local_38;
  
  AActor::PosRelative(&pos,&light->super_AActor,group);
  fVar7 = Plane::DistToPoint(p,(float)pos.X,(float)pos.Z,(float)pos.Y);
  if (((light->super_AActor).flags2.Value & 0x10000000) == 0) {
    fVar12 = light->m_currentRadius + light->m_currentRadius;
  }
  else {
    fVar12 = 0.0;
  }
  bVar3 = false;
  if ((0.0 < fVar12) && (bVar3 = false, ABS(fVar7) <= fVar12)) {
    if ((checkside) &&
       ((gl_lights_checkside.Value == true &&
        (bVar3 = Plane::PointOnSide(p,(float)pos.X,(float)pos.Z,(float)pos.Y), bVar3)))) {
      return false;
    }
    uVar4 = (light->super_AActor).flags4.Value;
    uVar6 = uVar4 & 0x400;
    fVar7 = *(float *)(&DAT_0067c020 + (ulong)(uVar6 == 0) * 4);
    uVar1 = *(undefined8 *)(light->super_AActor).args;
    local_80 = (float)(byte)(light->super_AActor).args[2] * fVar7;
    fVar8 = fVar7 * (float)((uint)uVar1 & 0xff);
    fVar7 = fVar7 * (float)((uint)((ulong)uVar1 >> 0x20) & 0xff);
    local_48 = CONCAT44(fVar7,fVar8);
    if ((uVar4 >> 0xb & 1) == 0) {
      uVar6 = uVar6 >> 9;
    }
    else {
      local_38.m_vec[1] = fVar7;
      local_38.m_vec[0] = fVar8;
      local_38.m_length = -1.0;
      local_38.m_vec[2] = local_80;
      fVar9 = Vector::Length(&local_38);
      fVar10 = Vector::Length(&local_38);
      fVar11 = Vector::Length(&local_38);
      local_80 = fVar11 - local_80;
      uVar6 = 1;
      local_48 = CONCAT44(fVar10 - fVar7,fVar9 - fVar8);
    }
    uVar4 = TArray<float,_float>::Reserve
                      ((TArray<float,_float> *)((long)&ldata->arrays[0].Array + (ulong)(uVar6 << 4))
                       ,8);
    uVar5 = (ulong)uVar4;
    lVar2 = *(long *)((long)&ldata->arrays[0].Array + (ulong)(uVar6 << 4));
    *(ulong *)(lVar2 + uVar5 * 4) = CONCAT44((float)pos.Z,(float)pos.X);
    *(float *)(lVar2 + 8 + uVar5 * 4) = (float)pos.Y;
    *(float *)(lVar2 + 0xc + uVar5 * 4) = fVar12;
    *(undefined8 *)(lVar2 + 0x10 + uVar5 * 4) = local_48;
    *(float *)(lVar2 + 0x18 + uVar5 * 4) = local_80;
    *(undefined4 *)(lVar2 + 0x1c + uVar5 * 4) = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool gl_GetLight(int group, Plane & p, ADynamicLight * light, bool checkside, FDynLightData &ldata)
{
	int i = 0;

	DVector3 pos = light->PosRelative(group);
	
	float dist = fabsf(p.DistToPoint(pos.X, pos.Z, pos.Y));
	float radius = (light->GetRadius());
	
	if (radius <= 0.f) return false;
	if (dist > radius) return false;
	if (checkside && gl_lights_checkside && p.PointOnSide(pos.X, pos.Z, pos.Y))
	{
		return false;
	}


	float cs;
	if (light->IsAdditive()) 
	{
		cs = 0.2f;
		i = 2;
	}
	else 
	{
		cs = 1.0f;
	}

	float r = light->GetRed() / 255.0f * cs;
	float g = light->GetGreen() / 255.0f * cs;
	float b = light->GetBlue() / 255.0f * cs;

	if (light->IsSubtractive())
	{
		Vector v;
		
		v.Set(r, g, b);
		r = v.Length() - r;
		g = v.Length() - g;
		b = v.Length() - b;
		i = 1;
	}

	float *data = &ldata.arrays[i][ldata.arrays[i].Reserve(8)];
	data[0] = pos.X;
	data[1] = pos.Z;
	data[2] = pos.Y;
	data[3] = radius;
	data[4] = r;
	data[5] = g;
	data[6] = b;
	data[7] = 0;
	return true;
}